

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O1

void __thiscall
CCIT<TTA>::PerformLabelingMem
          (CCIT<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Mat1b *pMVar5;
  long lVar6;
  bool bVar7;
  pointer puVar8;
  pointer piVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint v;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  double dVar38;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  uint local_348;
  long local_308;
  undefined1 local_2d0 [104];
  Mat local_268 [16];
  long local_258;
  long *local_220;
  long local_208;
  ulong local_200;
  long local_1f8;
  long local_1f0;
  undefined1 local_1e8 [104];
  Mat local_180 [16];
  long local_170;
  long *local_138;
  CCIT<TTA> *local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1e8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar12 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar12 << 0x20 | uVar12 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2d0,&local_110,0);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar5->field_0x8;
  iVar36 = *(int *)&pMVar5->field_0xc;
  TTA::MemAlloc(((iVar36 - (iVar36 + 1 >> 0x1f)) + 1 >> 1) *
                ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar5->field_0xc;
  lVar17 = (long)iVar3;
  uVar4 = *(uint *)&pMVar5->field_0x8;
  uVar12 = (ulong)uVar4;
  local_120 = this;
  local_118 = accesses;
  if (0 < lVar17) {
    iVar36 = 0;
    do {
      lVar32 = (long)iVar36;
      piVar1 = (int *)(local_170 + lVar32 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(local_1e8._24_8_ + lVar32) == '\0') {
        iVar16 = iVar36 + 1;
        if ((iVar16 < iVar3) &&
           (piVar1 = (int *)(local_170 + 4 + lVar32 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(local_1e8._24_8_ + 1 + lVar32) != '\0')) {
LAB_001d4c5d:
          local_348 = TTA::MemNewLabel();
          piVar1 = (int *)(local_258 + lVar32 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2d0._24_8_ + lVar32 * 4) = local_348;
          bVar7 = true;
          goto LAB_001d4c83;
        }
        if (((int)uVar4 < 2) ||
           (piVar1 = (int *)(*local_138 + local_170 + lVar32 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(lVar32 + *(long *)local_1e8._80_8_ + local_1e8._24_8_) == '\0')) {
          bVar7 = false;
          if (((int)uVar4 < 2) || (iVar3 <= iVar16)) goto LAB_001d4c83;
          piVar1 = (int *)(local_170 + *local_138 + 4 + lVar32 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar32 + 1 + local_1e8._24_8_ + *(long *)local_1e8._80_8_) != '\0')
          goto LAB_001d4c5d;
        }
        else {
          local_348 = TTA::MemNewLabel();
          piVar1 = (int *)(local_258 + lVar32 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(local_2d0._24_8_ + lVar32 * 4) = local_348;
          if (iVar16 < iVar3) {
            piVar1 = (int *)(local_170 + *local_138 + 4 + lVar32 * 4);
            *piVar1 = *piVar1 + 1;
            cVar2 = *(char *)(lVar32 + 1 + local_1e8._24_8_ + *(long *)local_1e8._80_8_);
            goto joined_r0x001d4c37;
          }
        }
LAB_001d4c81:
        bVar7 = false;
      }
      else {
        local_348 = TTA::MemNewLabel();
        piVar1 = (int *)(local_258 + lVar32 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2d0._24_8_ + lVar32 * 4) = local_348;
        if (iVar3 <= iVar36 + 1) goto LAB_001d4c81;
        piVar1 = (int *)(local_170 + 4 + lVar32 * 4);
        *piVar1 = *piVar1 + 1;
        bVar7 = true;
        if (*(char *)(local_1e8._24_8_ + 1 + lVar32) == '\0') {
          if (1 < (int)uVar4) {
            piVar1 = (int *)(local_170 + *local_138 + 4 + lVar32 * 4);
            *piVar1 = *piVar1 + 1;
            cVar2 = *(char *)(lVar32 + 1 + local_1e8._24_8_ + *(long *)local_1e8._80_8_);
joined_r0x001d4c37:
            bVar7 = true;
            if (cVar2 != '\0') goto LAB_001d4c83;
          }
          goto LAB_001d4c81;
        }
      }
LAB_001d4c83:
      iVar16 = iVar36 + 2;
      if ((bVar7) && (iVar16 < iVar3)) {
        lVar33 = (long)iVar16;
        lVar32 = lVar33 * 4;
        lVar30 = 0;
        do {
          piVar1 = (int *)(local_170 + lVar32 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          iVar16 = iVar36 + 3 + (int)lVar30;
          if (*(char *)(lVar30 + local_1e8._24_8_ + lVar33) == '\0') {
            if ((iVar16 < iVar3) &&
               (piVar1 = (int *)(local_170 + (long)iVar16 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(local_1e8._24_8_ + (long)iVar16) != '\0')) {
              if (((int)uVar4 < 2) ||
                 (piVar1 = (int *)(local_170 + *local_138 + lVar32 + lVar30 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(lVar30 + local_1e8._24_8_ + *(long *)local_1e8._80_8_ + lVar33) == '\0'))
              goto LAB_001d4e2b;
              piVar1 = (int *)(local_258 + lVar32 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2d0._24_8_ + lVar32 + lVar30 * 4) = local_348;
            }
            else {
              if (1 < (int)uVar4) {
                lVar23 = *local_138;
                piVar1 = (int *)(lVar23 + local_170 + lVar32 + lVar30 * 4);
                *piVar1 = *piVar1 + 1;
                lVar21 = *(long *)local_1e8._80_8_;
                if (*(char *)(lVar30 + lVar21 + local_1e8._24_8_ + lVar33) != '\0') {
                  piVar1 = (int *)(local_258 + lVar32 + lVar30 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(local_2d0._24_8_ + lVar32 + lVar30 * 4) = local_348;
                  if (iVar16 < iVar3) {
                    piVar1 = (int *)(lVar23 + local_170 + (long)iVar16 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar2 = *(char *)(lVar21 + local_1e8._24_8_ + (long)iVar16);
                    goto joined_r0x001d4e05;
                  }
                  goto LAB_001d4e56;
                }
              }
              bVar7 = false;
              if (((int)uVar4 < 2) || (iVar3 <= iVar16)) goto LAB_001d4e59;
              piVar1 = (int *)(local_170 + *local_138 + (long)iVar16 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)iVar16 + local_1e8._24_8_ + *(long *)local_1e8._80_8_) == '\0')
              goto LAB_001d4e56;
LAB_001d4e2b:
              local_348 = TTA::MemNewLabel();
              piVar1 = (int *)(local_258 + lVar32 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_2d0._24_8_ + lVar32 + lVar30 * 4) = local_348;
            }
            bVar7 = true;
          }
          else {
            piVar1 = (int *)(local_258 + lVar32 + lVar30 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2d0._24_8_ + lVar32 + lVar30 * 4) = local_348;
            if (iVar16 < iVar3) {
              lVar23 = (long)iVar16;
              piVar1 = (int *)(local_170 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              bVar7 = true;
              if (*(char *)(local_1e8._24_8_ + lVar23) != '\0') goto LAB_001d4e59;
              if (1 < (int)uVar4) {
                piVar1 = (int *)(local_170 + *local_138 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                cVar2 = *(char *)(lVar23 + local_1e8._24_8_ + *(long *)local_1e8._80_8_);
joined_r0x001d4e05:
                bVar7 = true;
                if (cVar2 != '\0') goto LAB_001d4e59;
              }
            }
LAB_001d4e56:
            bVar7 = false;
          }
LAB_001d4e59:
          lVar23 = lVar30 + 2;
        } while ((bVar7) && (lVar21 = lVar33 + lVar30, lVar30 = lVar23, lVar21 + 2 < lVar17));
        iVar16 = iVar36 + (int)lVar23 + 2;
      }
      iVar36 = iVar16;
    } while (iVar16 < iVar3);
  }
  if (2 < (int)uVar4) {
    uVar34 = 2;
    local_1f0 = 3;
    local_208 = 1;
    local_308 = 0;
    do {
      if (0 < iVar3) {
        lVar32 = uVar34 - 1;
        lVar30 = uVar34 - 2;
        uVar13 = uVar34 | 1;
        uVar37 = 0;
        do {
          lVar33 = *local_138;
          lVar24 = lVar33 * uVar34 + local_170;
          iVar36 = (int)uVar37;
          lVar21 = (long)iVar36;
          piVar1 = (int *)(lVar24 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar23 = *(long *)local_1e8._80_8_;
          lVar26 = lVar23 * uVar34 + local_1e8._24_8_;
          uVar19 = iVar36 + 1;
          local_1f8 = lVar21;
          if (*(char *)(lVar21 + lVar26) == '\0') {
            if ((iVar3 <= (int)uVar19) ||
               (piVar1 = (int *)(lVar24 + 4 + lVar21 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar26 + 1 + lVar21) == '\0')) {
              if ((uVar12 <= uVar13) ||
                 (piVar1 = (int *)(lVar33 * uVar13 + local_170 + lVar21 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar21 + lVar23 * uVar13 + local_1e8._24_8_) == '\0')) {
                bVar7 = false;
                if ((uVar13 < uVar12) && (bVar7 = false, (int)uVar19 < iVar3)) {
                  piVar1 = (int *)(local_170 + lVar33 * uVar13 + 4 + lVar21 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar21 + 1 + local_1e8._24_8_ + lVar23 * uVar13) == '\0')
                  goto LAB_001d5545;
                  local_348 = TTA::MemNewLabel();
                  piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar21 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                       local_348;
                  bVar7 = true;
                }
                goto LAB_001d58e1;
              }
              local_348 = TTA::MemNewLabel();
              piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                   local_348;
              if ((int)uVar19 < iVar3) goto LAB_001d54f8;
              goto LAB_001d5545;
            }
            lVar33 = local_170 + lVar33 * lVar32;
            piVar1 = (int *)(lVar33 + 4 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar23 = local_1e8._24_8_ + lVar23 * lVar32;
            if (*(char *)(lVar21 + 1 + lVar23) == '\0') {
              piVar1 = (int *)(lVar33 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar23 + lVar21) != '\0') {
                lVar24 = *local_220;
                lVar18 = lVar24 * lVar30 + local_258;
                piVar1 = (int *)(lVar18 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                lVar26 = *(long *)local_2d0._80_8_;
                lVar22 = lVar26 * lVar30 + local_2d0._24_8_;
                local_348 = *(uint *)(lVar22 + lVar21 * 4);
                piVar1 = (int *)(lVar24 * uVar34 + local_258 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar26 * uVar34 + local_2d0._24_8_ + lVar21 * 4) = local_348;
                if ((iVar36 + 2 < iVar3) &&
                   (piVar1 = (int *)(lVar33 + 8 + lVar21 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar23 + 2 + lVar21) != '\0')) {
                  piVar1 = (int *)(lVar18 + 8 + lVar21 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar19 = *(uint *)(lVar22 + 8 + lVar21 * 4);
                  goto LAB_001d56ed;
                }
                goto LAB_001d56f5;
              }
              if ((iVar3 <= iVar36 + 2) ||
                 (piVar1 = (int *)(lVar33 + 8 + lVar21 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar23 + 2 + lVar21) == '\0')) {
LAB_001d589a:
                local_348 = TTA::MemNewLabel();
                piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                     local_348;
                goto LAB_001d58db;
              }
              lVar33 = *local_220;
              piVar1 = (int *)(lVar33 * lVar30 + local_258 + 8 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar23 = *(long *)local_2d0._80_8_;
              local_348 = *(uint *)(lVar23 * lVar30 + local_2d0._24_8_ + 8 + lVar21 * 4);
            }
            else {
              lVar33 = *local_220;
              piVar1 = (int *)(lVar33 * lVar30 + local_258 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar23 = *(long *)local_2d0._80_8_;
              local_348 = *(uint *)(lVar23 * lVar30 + local_2d0._24_8_ + lVar21 * 4);
            }
            piVar1 = (int *)(lVar33 * uVar34 + local_258 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar23 * uVar34 + local_2d0._24_8_ + lVar21 * 4) = local_348;
LAB_001d58db:
            bVar7 = true;
          }
          else if (((int)uVar19 < iVar3) &&
                  (piVar1 = (int *)(lVar24 + 4 + lVar21 * 4), *piVar1 = *piVar1 + 1,
                  *(char *)(lVar26 + 1 + lVar21) != '\0')) {
            lVar33 = local_170 + lVar33 * lVar32;
            piVar1 = (int *)(lVar33 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar23 = local_1e8._24_8_ + lVar23 * lVar32;
            if (*(char *)(lVar21 + lVar23) == '\0') {
              piVar1 = (int *)(lVar33 + 4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar23 + 1 + lVar21) == '\0') {
                if ((iVar36 < 2) ||
                   (piVar1 = (int *)(lVar33 + -4 + lVar21 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar23 + -1 + lVar21) == '\0')) {
                  if ((iVar3 <= iVar36 + 2) ||
                     (piVar1 = (int *)(lVar33 + 8 + lVar21 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar23 + 2 + lVar21) == '\0')) goto LAB_001d589a;
                  lVar33 = *local_220;
                  piVar1 = (int *)(lVar33 * lVar30 + local_258 + 8 + lVar21 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_348 = *(uint *)(*(long *)local_2d0._80_8_ * lVar30 + local_2d0._24_8_ + 8 +
                                       lVar21 * 4);
                  piVar1 = (int *)(lVar33 * uVar34 + local_258 + lVar21 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                       local_348;
                  goto LAB_001d58db;
                }
                lVar24 = *local_220;
                lVar18 = lVar24 * lVar30 + local_258;
                piVar1 = (int *)(lVar18 + -8 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                lVar26 = *(long *)local_2d0._80_8_;
                lVar22 = lVar26 * lVar30 + local_2d0._24_8_;
                local_348 = *(uint *)(lVar22 + -8 + lVar21 * 4);
                piVar1 = (int *)(lVar24 * uVar34 + local_258 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar26 * uVar34 + local_2d0._24_8_ + lVar21 * 4) = local_348;
                bVar7 = true;
                if ((iVar36 + 2 < iVar3) &&
                   (piVar1 = (int *)(lVar33 + 8 + uVar37 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar23 + 2 + uVar37) != '\0')) {
                  piVar1 = (int *)(lVar18 + 8 + uVar37 * 4);
                  *piVar1 = *piVar1 + 1;
                  TTA::MemMerge(local_348,*(uint *)(lVar22 + 8 + uVar37 * 4));
                }
              }
              else {
                piVar1 = (int *)(*local_220 * lVar30 + local_258 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                local_348 = *(uint *)(*(long *)local_2d0._80_8_ * lVar30 + local_2d0._24_8_ +
                                     lVar21 * 4);
                piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                     local_348;
                bVar7 = true;
                if ((1 < iVar36) &&
                   (piVar1 = (int *)(*local_138 * lVar32 + local_170 + -4 + lVar21 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(lVar21 + -1 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_) !=
                   '\0')) {
                  piVar1 = (int *)(*local_220 * lVar30 + local_258 + -8 + lVar21 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar19 = *(uint *)(*(long *)local_2d0._80_8_ * lVar30 + local_2d0._24_8_ + -8 +
                                    lVar21 * 4);
                  goto LAB_001d56ed;
                }
              }
            }
            else {
              piVar1 = (int *)(*local_220 * lVar30 + local_258 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_348 = *(uint *)(*(long *)local_2d0._80_8_ * lVar30 + local_2d0._24_8_ +
                                   lVar21 * 4);
              piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                   local_348;
              piVar1 = (int *)(*local_138 * lVar32 + local_170 + 4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              bVar7 = true;
              if (((*(char *)(lVar21 + 1 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_) ==
                    '\0') && (iVar36 + 2 < iVar3)) &&
                 (piVar1 = (int *)(*local_138 * lVar32 + local_170 + 8 + lVar21 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(lVar21 + 2 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_) !=
                 '\0')) {
                piVar1 = (int *)(*local_220 * lVar30 + local_258 + 8 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                uVar19 = *(uint *)(*(long *)local_2d0._80_8_ * lVar30 + local_2d0._24_8_ + 8 +
                                  lVar21 * 4);
LAB_001d56ed:
                TTA::MemMerge(local_348,uVar19);
LAB_001d56f5:
                bVar7 = true;
              }
            }
          }
          else {
            piVar1 = (int *)(*local_138 * lVar32 + local_170 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar21 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_) == '\0') {
              if ((iVar36 < 2) ||
                 (piVar1 = (int *)(*local_138 * lVar32 + local_170 + -4 + lVar21 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(lVar21 + -1 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_) ==
                 '\0')) {
                if (((int)uVar19 < iVar3) &&
                   (piVar1 = (int *)(*local_138 * lVar32 + local_170 + 4 + lVar21 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(lVar21 + 1 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_) !=
                   '\0')) goto LAB_001d5102;
                local_348 = TTA::MemNewLabel();
                piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                     local_348;
              }
              else {
                piVar1 = (int *)(*local_220 * lVar30 + local_258 + -8 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                local_348 = *(uint *)(*(long *)local_2d0._80_8_ * lVar30 + local_2d0._24_8_ + -8 +
                                     lVar21 * 4);
                piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                     local_348;
                if (((int)uVar19 < iVar3) &&
                   (piVar1 = (int *)(*local_138 * lVar32 + local_170 + (ulong)uVar19 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)((ulong)uVar19 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_)
                   != '\0')) {
                  piVar1 = (int *)(*local_220 * lVar30 + local_258 + lVar21 * 4);
                  *piVar1 = *piVar1 + 1;
                  TTA::MemMerge(local_348,
                                *(uint *)(*(long *)local_2d0._80_8_ * lVar30 + local_2d0._24_8_ +
                                         lVar21 * 4));
                }
              }
            }
            else {
LAB_001d5102:
              piVar1 = (int *)(*local_220 * lVar30 + local_258 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_348 = *(uint *)(*(long *)local_2d0._80_8_ * lVar30 + local_2d0._24_8_ +
                                   lVar21 * 4);
              piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar21 * 4) =
                   local_348;
            }
            if (((int)uVar19 < iVar3) && (uVar13 < uVar12)) {
LAB_001d54f8:
              piVar1 = (int *)(*local_138 * uVar13 + local_170 + 4 + local_1f8 * 4);
              *piVar1 = *piVar1 + 1;
              bVar7 = true;
              if (*(char *)(local_1f8 + 1 + *(long *)local_1e8._80_8_ * uVar13 + local_1e8._24_8_)
                  != '\0') goto LAB_001d58e1;
            }
LAB_001d5545:
            bVar7 = false;
          }
LAB_001d58e1:
          uVar19 = iVar36 + 2;
          if ((bVar7) && ((int)uVar19 < iVar3)) {
            lVar21 = (long)(int)uVar19;
            lVar33 = lVar21 * 4;
            lVar23 = 0;
            do {
              lVar24 = *local_138;
              lVar22 = lVar24 * uVar34 + local_170;
              piVar1 = (int *)(lVar22 + lVar33 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar26 = *(long *)local_1e8._80_8_;
              lVar18 = lVar26 * uVar34 + local_1e8._24_8_;
              uVar15 = uVar37 + 3 + lVar23;
              iVar11 = (int)uVar15;
              iVar16 = (int)lVar23;
              if (*(char *)(lVar23 + lVar18 + lVar21) == '\0') {
                if (iVar11 < iVar3) {
                  lVar28 = (long)iVar11;
                  piVar1 = (int *)(lVar22 + lVar28 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar18 + lVar28) != '\0') {
                    if (uVar13 < uVar12) {
                      piVar1 = (int *)(local_1f0 * lVar24 + local_170 + lVar33 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar23 + local_1f0 * lVar26 + local_1e8._24_8_ + lVar21) != '\0'
                         ) {
                        lVar22 = *local_220;
                        lVar18 = local_258 + lVar33;
                        piVar1 = (int *)(uVar34 * lVar22 + lVar18 + lVar23 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar6 = *(long *)local_2d0._80_8_;
                        lVar27 = lVar33 + local_2d0._24_8_;
                        *(uint *)(uVar34 * lVar6 + lVar27 + lVar23 * 4) = local_348;
                        lVar29 = local_170 + lVar24 * lVar32;
                        piVar1 = (int *)(lVar29 + lVar28 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar20 = local_1e8._24_8_ + lVar26 * lVar32;
                        if (*(char *)(lVar28 + lVar20) == '\0') {
                          piVar1 = (int *)(local_170 + lVar33 + lVar24 * local_208 + lVar23 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar23 + local_1e8._24_8_ + lVar21 + lVar26 * local_208) !=
                              '\0') {
                            iVar11 = iVar36 + iVar16 + 4;
                            if (iVar11 < iVar3) {
                              lVar24 = (long)iVar11;
                              piVar1 = (int *)(lVar29 + lVar24 * 4);
                              *piVar1 = *piVar1 + 1;
                              if (*(char *)(lVar20 + lVar24) != '\0') {
                                piVar1 = (int *)(lVar18 + local_308 * lVar22 + lVar23 * 4);
                                *piVar1 = *piVar1 + 1;
                                uVar19 = *(uint *)(lVar27 + local_308 * lVar6 + lVar23 * 4);
                                piVar1 = (int *)(local_258 + lVar22 * lVar30 + lVar24 * 4);
                                *piVar1 = *piVar1 + 1;
                                uVar19 = TTA::MemMerge(uVar19,*(uint *)(local_2d0._24_8_ +
                                                                        lVar6 * lVar30 + lVar24 * 4)
                                                      );
                                goto LAB_001d6512;
                              }
                            }
                            piVar1 = (int *)(lVar18 + lVar22 * local_308 + lVar23 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar19 = *(uint *)(lVar27 + lVar6 * local_308 + lVar23 * 4);
                            goto LAB_001d6512;
                          }
                        }
                        else {
                          piVar1 = (int *)(lVar18 + lVar22 * local_308 + lVar23 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar19 = *(uint *)(lVar27 + lVar6 * local_308 + lVar23 * 4);
LAB_001d6512:
                          TTA::MemMerge(local_348,uVar19);
                        }
                        iVar16 = iVar36 + iVar16 + 4;
                        bVar7 = true;
                        if (iVar16 < iVar3) {
                          lVar24 = (long)iVar16;
                          piVar1 = (int *)(*local_138 * lVar32 + local_170 + lVar24 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar24 + *(long *)local_1e8._80_8_ * lVar32 +
                                                 local_1e8._24_8_) != '\0') {
                            piVar1 = (int *)(*local_220 * lVar30 + local_258 + lVar24 * 4);
                            *piVar1 = *piVar1 + 1;
                            TTA::MemMerge(local_348,
                                          *(uint *)(*(long *)local_2d0._80_8_ * lVar30 +
                                                    local_2d0._24_8_ + lVar24 * 4));
                          }
                        }
                        goto LAB_001d5ebd;
                      }
                    }
                    lVar22 = lVar24 * lVar32 + local_170;
                    piVar1 = (int *)(lVar22 + lVar28 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar18 = lVar26 * lVar32 + local_1e8._24_8_;
                    if (*(char *)(lVar28 + lVar18) == '\0') {
                      piVar1 = (int *)(local_170 + lVar33 + lVar24 * local_208 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar23 + local_1e8._24_8_ + lVar21 + lVar26 * local_208) == '\0'
                         ) {
                        iVar16 = iVar36 + iVar16 + 4;
                        if (iVar16 < iVar3) {
                          lVar24 = (long)iVar16;
                          piVar1 = (int *)(lVar22 + lVar24 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar18 + lVar24) != '\0') {
                            lVar26 = *local_220;
                            piVar1 = (int *)(lVar26 * lVar30 + local_258 + lVar24 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar18 = *(long *)local_2d0._80_8_;
                            local_348 = *(uint *)(lVar18 * lVar30 + local_2d0._24_8_ + lVar24 * 4);
                            piVar1 = (int *)(local_258 + lVar33 + lVar26 * uVar34 + lVar23 * 4);
                            *piVar1 = *piVar1 + 1;
                            *(uint *)(local_2d0._24_8_ + lVar33 + lVar18 * uVar34 + lVar23 * 4) =
                                 local_348;
                            goto LAB_001d5f84;
                          }
                        }
                        local_348 = TTA::MemNewLabel();
                        piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar33 + lVar23 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar33 +
                                 lVar23 * 4) = local_348;
                        goto LAB_001d5f84;
                      }
                      lVar24 = *local_220;
                      piVar1 = (int *)(local_308 * lVar24 + lVar33 + local_258 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar26 = *(long *)local_2d0._80_8_;
                      local_348 = *(uint *)(local_308 * lVar26 + local_2d0._24_8_ + lVar33 +
                                           lVar23 * 4);
                      piVar1 = (int *)(uVar34 * lVar24 + lVar33 + local_258 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)(uVar34 * lVar26 + local_2d0._24_8_ + lVar33 + lVar23 * 4) =
                           local_348;
                      iVar16 = iVar36 + iVar16 + 4;
                      if (iVar16 < iVar3) {
                        lVar28 = (long)iVar16;
                        piVar1 = (int *)(lVar22 + lVar28 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar18 + lVar28) != '\0') {
                          piVar1 = (int *)(local_258 + lVar24 * lVar30 + lVar28 * 4);
                          *piVar1 = *piVar1 + 1;
                          TTA::MemMerge(local_348,
                                        *(uint *)(local_2d0._24_8_ + lVar26 * lVar30 + lVar28 * 4));
                        }
                      }
                      goto LAB_001d6111;
                    }
                    lVar24 = *local_220;
                    piVar1 = (int *)(local_308 * lVar24 + local_258 + lVar33 + lVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar26 = *(long *)local_2d0._80_8_;
                    local_348 = *(uint *)(local_308 * lVar26 + local_2d0._24_8_ + lVar33 +
                                         lVar23 * 4);
                    piVar1 = (int *)(lVar24 * uVar34 + local_258 + lVar33 + lVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(lVar26 * uVar34 + local_2d0._24_8_ + lVar33 + lVar23 * 4) = local_348;
LAB_001d5f84:
                    bVar7 = true;
                    goto LAB_001d5ebd;
                  }
                }
                if ((uVar13 < uVar12) &&
                   (piVar1 = (int *)(local_1f0 * lVar24 + lVar33 + local_170 + lVar23 * 4),
                   *piVar1 = *piVar1 + 1,
                   *(char *)(lVar23 + local_1f0 * lVar26 + local_1e8._24_8_ + lVar21) != '\0')) {
                  piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar33 + lVar23 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar33 +
                           lVar23 * 4) = local_348;
                  if (iVar11 < iVar3) {
                    piVar1 = (int *)(local_170 + lVar24 * uVar13 + (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    bVar7 = true;
                    if (*(char *)(local_1e8._24_8_ + lVar26 * uVar13 + (long)iVar11) != '\0')
                    goto LAB_001d5ebd;
                  }
LAB_001d5ee6:
                  bVar7 = false;
                }
                else {
                  bVar7 = false;
                  if ((uVar13 < uVar12) && (bVar7 = false, iVar11 < iVar3)) {
                    piVar1 = (int *)(local_170 + lVar24 * uVar13 + (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((long)iVar11 + local_1e8._24_8_ + lVar26 * uVar13) == '\0')
                    goto LAB_001d5ee6;
                    local_348 = TTA::MemNewLabel();
                    piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar33 + lVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar33 +
                             lVar23 * 4) = local_348;
                    bVar7 = true;
                  }
                }
              }
              else {
                local_200 = uVar37 + lVar23;
                lVar28 = *local_220;
                lVar27 = local_258 + lVar33;
                lVar31 = uVar34 * lVar28 + lVar27;
                piVar1 = (int *)(lVar31 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar6 = *(long *)local_2d0._80_8_;
                lVar29 = lVar33 + local_2d0._24_8_;
                lVar20 = uVar34 * lVar6 + lVar29;
                *(uint *)(lVar20 + lVar23 * 4) = local_348;
                iVar25 = (int)local_200;
                if (iVar11 < iVar3) {
                  lVar35 = (long)iVar11;
                  piVar1 = (int *)(lVar22 + lVar35 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar18 + lVar35) != '\0') {
                    lVar18 = lVar24 * lVar32 + local_170;
                    piVar1 = (int *)(local_170 + lVar33 + local_208 * lVar24 + lVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar24 = lVar26 * lVar32 + local_1e8._24_8_;
                    cVar2 = *(char *)(lVar23 + local_1e8._24_8_ + lVar21 + local_208 * lVar26);
                    piVar1 = (int *)(lVar18 + lVar35 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (cVar2 == '\0') {
                      if (*(char *)(lVar35 + lVar24) == '\0') {
                        if ((iVar25 < 0) ||
                           (uVar15 = (ulong)(iVar36 + iVar16 + 1),
                           piVar1 = (int *)(lVar18 + uVar15 * 4), *piVar1 = *piVar1 + 1,
                           *(char *)(lVar24 + uVar15) == '\0')) {
                          iVar16 = iVar36 + iVar16 + 4;
                          if (iVar16 < iVar3) {
                            lVar26 = (long)iVar16;
                            piVar1 = (int *)(lVar18 + lVar26 * 4);
                            *piVar1 = *piVar1 + 1;
                            if (*(char *)(lVar24 + lVar26) != '\0') {
                              piVar1 = (int *)(local_258 + lVar28 * lVar30 + lVar26 * 4);
                              *piVar1 = *piVar1 + 1;
                              TTA::MemMerge(local_348,
                                            *(uint *)(local_2d0._24_8_ + lVar6 * lVar30 + lVar26 * 4
                                                     ));
                            }
                          }
                          goto LAB_001d5a8c;
                        }
                        uVar19 = iVar36 + iVar16 + 4;
                        if ((int)uVar19 < iVar3) {
                          uVar15 = (ulong)uVar19;
                          piVar1 = (int *)(lVar18 + uVar15 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar24 + uVar15) != '\0') {
                            lVar18 = local_258 + lVar28 * lVar30;
                            lVar24 = (local_200 & 0xffffffff) * 4;
                            piVar1 = (int *)(lVar24 + lVar18);
                            *piVar1 = *piVar1 + 1;
                            lVar26 = local_2d0._24_8_ + lVar6 * lVar30;
                            uVar19 = *(uint *)(lVar24 + lVar26);
                            piVar1 = (int *)(lVar18 + uVar15 * 4);
                            *piVar1 = *piVar1 + 1;
                            v = *(uint *)(lVar26 + uVar15 * 4);
                            goto LAB_001d60cb;
                          }
                        }
                        lVar24 = (local_200 & 0xffffffff) * 4;
                        piVar1 = (int *)(lVar24 + local_258 + lVar28 * lVar30);
                        *piVar1 = *piVar1 + 1;
                        uVar19 = *(uint *)(lVar24 + local_2d0._24_8_ + lVar6 * lVar30);
                      }
                      else {
                        if ((iVar25 < 0) ||
                           (uVar15 = (ulong)(iVar36 + iVar16 + 1),
                           piVar1 = (int *)(lVar18 + uVar15 * 4), *piVar1 = *piVar1 + 1,
                           *(char *)(lVar24 + uVar15) == '\0')) goto LAB_001d60d7;
                        lVar24 = (local_200 & 0xffffffff) * 4;
                        piVar1 = (int *)(lVar24 + local_258 + lVar28 * lVar30);
                        *piVar1 = *piVar1 + 1;
                        uVar19 = *(uint *)(lVar24 + local_2d0._24_8_ + lVar6 * lVar30);
                        piVar1 = (int *)(lVar27 + local_308 * lVar28 + lVar23 * 4);
                        *piVar1 = *piVar1 + 1;
                        v = *(uint *)(lVar29 + local_308 * lVar6 + lVar23 * 4);
LAB_001d60cb:
                        uVar19 = TTA::MemMerge(uVar19,v);
                      }
                    }
                    else {
                      if (*(char *)(lVar35 + lVar24) != '\0') {
                        piVar1 = (int *)(lVar27 + lVar28 * local_308 + lVar23 * 4);
                        *piVar1 = *piVar1 + 1;
                        TTA::MemMerge(local_348,*(uint *)(lVar29 + lVar6 * local_308 + lVar23 * 4));
LAB_001d5a8c:
                        bVar7 = true;
                        goto LAB_001d5ebd;
                      }
                      iVar16 = iVar36 + iVar16 + 4;
                      if (iVar16 < iVar3) {
                        lVar26 = (long)iVar16;
                        piVar1 = (int *)(lVar18 + lVar26 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar24 + lVar26) != '\0') {
                          piVar1 = (int *)(lVar27 + local_308 * lVar28 + lVar23 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar19 = *(uint *)(lVar29 + local_308 * lVar6 + lVar23 * 4);
                          piVar1 = (int *)(local_258 + lVar28 * lVar30 + lVar26 * 4);
                          *piVar1 = *piVar1 + 1;
                          v = *(uint *)(local_2d0._24_8_ + lVar6 * lVar30 + lVar26 * 4);
                          goto LAB_001d60cb;
                        }
                      }
LAB_001d60d7:
                      piVar1 = (int *)(lVar27 + lVar28 * local_308 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar19 = *(uint *)(lVar29 + lVar6 * local_308 + lVar23 * 4);
                    }
                    TTA::MemMerge(local_348,uVar19);
LAB_001d6111:
                    bVar7 = true;
                    goto LAB_001d5ebd;
                  }
                }
                piVar1 = (int *)(lVar31 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar20 + lVar23 * 4) = local_348;
                piVar1 = (int *)(local_208 * lVar24 + lVar33 + local_170 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar23 + local_208 * lVar26 + local_1e8._24_8_ + lVar21) == '\0') {
                  lVar18 = local_170 + lVar24 * lVar32;
                  lVar24 = local_1e8._24_8_ + lVar26 * lVar32;
                  if ((-1 < iVar25) &&
                     (uVar14 = (ulong)(iVar36 + iVar16 + 1), piVar1 = (int *)(lVar18 + uVar14 * 4),
                     *piVar1 = *piVar1 + 1, *(char *)(lVar24 + uVar14) != '\0')) {
                    if ((iVar11 < iVar3) &&
                       (uVar15 = uVar15 & 0xffffffff, piVar1 = (int *)(lVar18 + uVar15 * 4),
                       *piVar1 = *piVar1 + 1, *(char *)(lVar24 + uVar15) != '\0')) {
                      lVar24 = (local_200 & 0xffffffff) * 4;
                      piVar1 = (int *)(lVar24 + local_258 + lVar28 * lVar30);
                      *piVar1 = *piVar1 + 1;
                      uVar19 = *(uint *)(lVar24 + local_2d0._24_8_ + lVar6 * lVar30);
                      piVar1 = (int *)(lVar27 + local_308 * lVar28 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar19 = TTA::MemMerge(uVar19,*(uint *)(lVar29 + local_308 * lVar6 +
                                                             lVar23 * 4));
                    }
                    else {
                      lVar24 = (local_200 & 0xffffffff) * 4;
                      piVar1 = (int *)(lVar24 + local_258 + lVar28 * lVar30);
                      *piVar1 = *piVar1 + 1;
                      uVar19 = *(uint *)(lVar24 + local_2d0._24_8_ + lVar6 * lVar30);
                    }
                    goto LAB_001d5b0f;
                  }
                  if (iVar11 < iVar3) {
                    piVar1 = (int *)(lVar18 + (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar24 + iVar11) != '\0') {
                      piVar1 = (int *)(lVar27 + lVar28 * local_308 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar19 = *(uint *)(lVar29 + lVar6 * local_308 + lVar23 * 4);
                      goto LAB_001d5b0f;
                    }
                    goto LAB_001d5b1a;
                  }
                }
                else {
                  piVar1 = (int *)(lVar27 + lVar28 * local_308 + lVar23 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar19 = *(uint *)(lVar29 + lVar6 * local_308 + lVar23 * 4);
LAB_001d5b0f:
                  TTA::MemMerge(local_348,uVar19);
LAB_001d5b1a:
                  if ((iVar11 < iVar3) && (uVar13 < uVar12)) {
                    piVar1 = (int *)(*local_138 * uVar13 + local_170 + (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    bVar7 = true;
                    if (*(char *)((long)iVar11 +
                                 *(long *)local_1e8._80_8_ * uVar13 + local_1e8._24_8_) != '\0')
                    goto LAB_001d5ebd;
                  }
                }
                bVar7 = false;
              }
LAB_001d5ebd:
              lVar24 = lVar23 + 2;
            } while ((bVar7) && (lVar26 = lVar21 + 2 + lVar23, lVar23 = lVar24, lVar26 < lVar17));
            uVar19 = (int)lVar24 + (int)local_1f8 + 2;
          }
          uVar37 = (ulong)uVar19;
        } while ((int)uVar19 < iVar3);
      }
      uVar34 = uVar34 + 2;
      local_1f0 = local_1f0 + 2;
      local_208 = local_208 + 2;
      local_308 = local_308 + 2;
    } while (uVar34 < uVar12);
  }
  uVar19 = TTA::MemFlatten();
  (local_120->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar19;
  if (0 < (int)uVar4) {
    local_200 = local_2d0._24_8_;
    lVar32 = 1;
    uVar34 = 0;
    do {
      piVar9 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar3) {
        uVar13 = uVar34 | 1;
        lVar30 = *(long *)local_2d0._80_8_;
        lVar33 = *local_220;
        lVar23 = 1;
        do {
          piVar1 = (int *)(lVar33 * uVar34 + local_258 + -4 + lVar23 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = (long)*(int *)(lVar30 * uVar34 + local_2d0._24_8_ + -4 + lVar23 * 4);
          if (lVar21 < 1) {
            piVar1 = (int *)(*local_220 * uVar34 + local_258 + -4 + lVar23 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + -4 + lVar23 * 4)
                 = 0;
            if (lVar23 < lVar17) {
              piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar23 * 4) =
                   0;
              if (uVar13 < uVar12) {
                piVar1 = (int *)(*local_220 * lVar32 + local_258 + -4 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)
                 (*(long *)local_2d0._80_8_ * lVar32 + local_2d0._24_8_ + -4 + lVar23 * 4) = 0;
                piVar1 = (int *)(*local_220 * lVar32 + local_258 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(*(long *)local_2d0._80_8_ * lVar32 + local_2d0._24_8_ + lVar23 * 4)
                     = 0;
              }
            }
            else if (uVar13 < uVar12) {
              piVar1 = (int *)(*local_220 * lVar32 + local_258 + -4 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)local_2d0._80_8_ * lVar32 + local_2d0._24_8_;
LAB_001d6999:
              *(undefined4 *)(lVar21 + -4 + lVar23 * 4) = 0;
            }
          }
          else {
            piVar9[lVar21] = piVar9[lVar21] + 1;
            uVar4 = puVar8[lVar21];
            piVar1 = (int *)(*local_138 * uVar34 + local_170 + -4 + lVar23 * 4);
            *piVar1 = *piVar1 + 1;
            uVar19 = uVar4;
            if (*(char *)(lVar23 + -1 + *(long *)local_1e8._80_8_ * uVar34 + local_1e8._24_8_) ==
                '\0') {
              uVar19 = 0;
            }
            piVar1 = (int *)(*local_220 * uVar34 + local_258 + -4 + lVar23 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + -4 + lVar23 * 4) =
                 uVar19;
            if (lVar23 < lVar17) {
              piVar1 = (int *)(*local_138 * uVar34 + local_170 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              uVar19 = uVar4;
              if (*(char *)(lVar23 + *(long *)local_1e8._80_8_ * uVar34 + local_1e8._24_8_) == '\0')
              {
                uVar19 = 0;
              }
              piVar1 = (int *)(*local_220 * uVar34 + local_258 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2d0._80_8_ * uVar34 + local_2d0._24_8_ + lVar23 * 4) = uVar19
              ;
              if (uVar13 < uVar12) {
                piVar1 = (int *)(*local_138 * lVar32 + local_170 + -4 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                uVar19 = uVar4;
                if (*(char *)(lVar23 + -1 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_)
                    == '\0') {
                  uVar19 = 0;
                }
                piVar1 = (int *)(*local_220 * lVar32 + local_258 + -4 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d0._80_8_ * lVar32 + local_2d0._24_8_ + -4 + lVar23 * 4) =
                     uVar19;
                piVar1 = (int *)(*local_138 * lVar32 + local_170 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                cVar2 = *(char *)(lVar23 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_);
                piVar1 = (int *)(*local_220 * lVar32 + local_258 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar21 = *(long *)local_2d0._80_8_ * lVar32 + local_2d0._24_8_;
                if (cVar2 == '\0') {
                  *(undefined4 *)(lVar21 + lVar23 * 4) = 0;
                }
                else {
                  *(uint *)(lVar21 + lVar23 * 4) = uVar4;
                }
              }
            }
            else if (uVar13 < uVar12) {
              piVar1 = (int *)(*local_138 * lVar32 + local_170 + -4 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              cVar2 = *(char *)(lVar23 + -1 + *(long *)local_1e8._80_8_ * lVar32 + local_1e8._24_8_)
              ;
              piVar1 = (int *)(*local_220 * lVar32 + local_258 + -4 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)local_2d0._80_8_ * lVar32 + local_2d0._24_8_;
              if (cVar2 == '\0') goto LAB_001d6999;
              *(uint *)(lVar21 + -4 + lVar23 * 4) = uVar4;
            }
          }
          lVar21 = lVar23 + 1;
          lVar23 = lVar23 + 2;
        } while (lVar21 < lVar17);
      }
      uVar34 = uVar34 + 2;
      lVar32 = lVar32 + 2;
    } while (uVar34 < uVar12);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar10 = local_118;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_118,local_108);
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_180;
  cv::sum((_InputArray *)local_108);
  *(pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_268;
  cv::sum((_InputArray *)local_108);
  (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_108 >> 0x3f & (long)((double)local_108 - 9.223372036854776e+18) |
       (long)(double)local_108;
  dVar38 = TTA::MemTotalAccesses();
  (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar38 >> 0x3f & (long)(dVar38 - 9.223372036854776e+18) | (long)dVar38;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_2d0);
  cv::Mat::operator=(&((local_120->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_268);
  cv::Mat::~Mat((Mat *)(local_2d0 + 8));
  cv::Mat::~Mat(local_180);
  cv::Mat::~Mat((Mat *)(local_1e8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

        int lx, u, v, k;

#define CONDITION_B1 img(y, x) > 0 
#define CONDITION_B2 x+1<w && img(y, x+1) > 0                // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img(y + 1, x) > 0              // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img(y + 1, x + 1) > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img(y - 1, x - 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U2 img(y - 1, x) > 0
#define CONDITION_U3 x+1<w && img(y - 1, x + 1) > 0          // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img(y - 1, x + 2) > 0          // WRONG in the original code -> add missing condition
#define ASSIGN_S  img_labels(y, x) = img_labels(y, x - 2)
#define ASSIGN_P  img_labels(y, x) = img_labels(y - 2, x - 2)
#define ASSIGN_Q  img_labels(y, x) = img_labels(y - 2, x)
#define ASSIGN_R  img_labels(y, x) = img_labels(y - 2, x + 2)
#define ASSIGN_LX img_labels(y, x) = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels(y - 2, x-2)
#define LOAD_PV v = img_labels(y - 2, x-2)
#define LOAD_QU u = img_labels(y - 2, x)
#define LOAD_QV v = img_labels(y - 2, x)
#define LOAD_QK k = img_labels(y - 2, x)
#define LOAD_RV v = img_labels(y - 2, x+2)
#define LOAD_RK k = img_labels(y - 2, x+2)
#define NEW_LABEL lx = img_labels(y, x) = LabelsSolver::MemNewLabel();
#define RESOLVE_2(u, v) LabelsSolver::MemMerge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::MemMerge(u,LabelsSolver::MemMerge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }